

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

bool __thiscall
anurbs::RTree<3L>::PickByBox::operator()(PickByBox *this,Vector *box_min,Vector *box_max)

{
  double dVar1;
  CoeffReturnType pdVar2;
  long local_30;
  Index i;
  Vector *box_max_local;
  Vector *box_min_local;
  PickByBox *this_local;
  
  local_30 = 0;
  while( true ) {
    if (2 < local_30) {
      return true;
    }
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)&this->m_box_max
                        ,local_30);
    dVar1 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_min,local_30
                       );
    if (dVar1 < *pdVar2) break;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)this,local_30);
    dVar1 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_max,local_30
                       );
    if (*pdVar2 <= dVar1 && dVar1 != *pdVar2) {
      return false;
    }
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool operator()(const Vector box_min, const Vector box_max) const noexcept
        {
            for (Index i = 0; i < TDimension; i++) {
                if (m_box_max[i] < box_min[i]) {
                    return false;
                }
                if (m_box_min[i] > box_max[i]) {
                    return false;
                }
            }
            return true;
        }